

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep * triggerStepAllocate(Parse *pParse,u8 op,Token *pName,char *zStart,char *zEnd)

{
  sqlite3 *db_00;
  Token *z_00;
  char *pcVar1;
  char *z;
  TriggerStep *pTriggerStep;
  sqlite3 *db;
  char *zEnd_local;
  char *zStart_local;
  Token *pName_local;
  u8 op_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pParse->nErr == 0) {
    pParse_local = (Parse *)sqlite3DbMallocZero(db_00,(ulong)pName->n + 0x61);
    if (pParse_local != (Parse *)0x0) {
      z_00 = &pParse_local->constraintName;
      memcpy(z_00,pName->z,(ulong)pName->n);
      sqlite3Dequote((char *)z_00);
      *(Token **)&pParse_local->rc = z_00;
      *(u8 *)&pParse_local->db = op;
      pcVar1 = triggerSpanDup(db_00,zStart,zEnd);
      *(char **)&pParse_local->nLabelAlloc = pcVar1;
      if (1 < pParse->eParseMode) {
        sqlite3RenameTokenMap(pParse,*(void **)&pParse_local->rc,pName);
      }
    }
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (TriggerStep *)pParse_local;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  Parse *pParse,              /* Parser context */
  u8 op,                      /* Trigger opcode */
  Token *pName,               /* The target name */
  const char *zStart,         /* Start of SQL text */
  const char *zEnd            /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  if( pParse->nErr ) return 0;
  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
    pTriggerStep->zSpan = triggerSpanDup(db, zStart, zEnd);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, pTriggerStep->zTarget, pName);
    }
  }
  return pTriggerStep;
}